

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O1

IntrRecvError InterruptibleRecv(uint8_t *data,size_t len,milliseconds timeout,Sock *sock)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  int extraout_var;
  int *piVar7;
  long lVar8;
  long lVar9;
  long in_FS_OFFSET;
  IntrRecvError local_3c;
  long lVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = std::chrono::_V2::steady_clock::now();
  lVar5 = lVar5 / 1000000;
  lVar8 = timeout.__r + lVar5;
  do {
    if ((len == 0) || (lVar9 = lVar8 - lVar5, lVar9 == 0 || lVar8 < lVar5)) {
      local_3c = (IntrRecvError)(len != 0);
      break;
    }
    iVar4 = (*sock->_vptr_Sock[4])(sock,data,len,0);
    lVar6 = CONCAT44(extraout_var,iVar4);
    if (lVar6 == 0 || extraout_var < 0) {
      if (lVar6 == 0) {
        local_3c = Disconnected;
      }
      else {
        piVar7 = __errno_location();
        iVar4 = *piVar7;
        if (((iVar4 == 0xb) || (iVar4 == 0x73)) || (iVar4 == 0x16)) {
          if (999 < lVar9) {
            lVar9 = 1000;
          }
          iVar4 = (*sock->_vptr_Sock[0xe])(sock,lVar9,1,0);
          cVar3 = (char)iVar4;
          if (cVar3 == '\0') {
            local_3c = NetworkError;
          }
        }
        else {
          local_3c = NetworkError;
          cVar3 = '\0';
        }
        if (cVar3 != '\0') goto LAB_006aeb96;
      }
LAB_006aec41:
      bVar2 = false;
    }
    else {
      len = len - lVar6;
      data = data + lVar6;
LAB_006aeb96:
      bVar2 = CThreadInterrupt::operator_cast_to_bool(&g_socks5_interrupt);
      if (bVar2) {
        local_3c = Interrupted;
        goto LAB_006aec41;
      }
      lVar5 = std::chrono::_V2::steady_clock::now();
      lVar5 = lVar5 / 1000000;
      bVar2 = true;
    }
  } while (bVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_3c;
}

Assistant:

static IntrRecvError InterruptibleRecv(uint8_t* data, size_t len, std::chrono::milliseconds timeout, const Sock& sock)
{
    auto curTime{Now<SteadyMilliseconds>()};
    const auto endTime{curTime + timeout};
    while (len > 0 && curTime < endTime) {
        ssize_t ret = sock.Recv(data, len, 0); // Optimistically try the recv first
        if (ret > 0) {
            len -= ret;
            data += ret;
        } else if (ret == 0) { // Unexpected disconnection
            return IntrRecvError::Disconnected;
        } else { // Other error or blocking
            int nErr = WSAGetLastError();
            if (nErr == WSAEINPROGRESS || nErr == WSAEWOULDBLOCK || nErr == WSAEINVAL) {
                // Only wait at most MAX_WAIT_FOR_IO at a time, unless
                // we're approaching the end of the specified total timeout
                const auto remaining = std::chrono::milliseconds{endTime - curTime};
                const auto timeout = std::min(remaining, std::chrono::milliseconds{MAX_WAIT_FOR_IO});
                if (!sock.Wait(timeout, Sock::RECV)) {
                    return IntrRecvError::NetworkError;
                }
            } else {
                return IntrRecvError::NetworkError;
            }
        }
        if (g_socks5_interrupt) {
            return IntrRecvError::Interrupted;
        }
        curTime = Now<SteadyMilliseconds>();
    }
    return len == 0 ? IntrRecvError::OK : IntrRecvError::Timeout;
}